

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactory.cpp
# Opt level: O3

string * __thiscall
ApprovalTests::ReporterFactory::findReporterName
          (string *__return_storage_ptr__,ReporterFactory *this,string *osPrefix,
          string *reporterName)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  long *plVar5;
  _Rb_tree_node_base *p_Var6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  pointer pbVar10;
  string *psVar11;
  bool bVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string trimmedReporterName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  candidateNames;
  allocator_type local_1e1;
  string local_1e0;
  string local_1c0;
  string *local_1a0;
  ReporterFactory *local_198;
  string local_190;
  pointer local_170;
  undefined1 local_168 [32];
  _Any_data local_148;
  _Manager_type local_138 [2];
  long *local_128;
  long local_120;
  long local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar2 = (reporterName->_M_dataplus)._M_p;
  local_198 = this;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + reporterName->_M_string_length);
  StringUtils::trim(&local_1e0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_1e0._M_dataplus._M_p,
             local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
  StringUtils::toLower((string *)local_168,&local_90);
  ::std::__cxx11::string::operator=((string *)&local_1e0,(string *)local_168);
  if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
    operator_delete((void *)local_168._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_168._0_8_ = local_168 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_168,local_1e0._M_dataplus._M_p,
             local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
  local_148._M_unused._0_8_ = (undefined8)(local_168 + 0x30);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_168 + 0x20),local_1e0._M_dataplus._M_p,
             local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
  ::std::__cxx11::string::append((char *)(local_168 + 0x20));
  pcVar2 = (osPrefix->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + osPrefix->_M_string_length);
  StringUtils::toLower(&local_190,&local_b0);
  plVar5 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_190,(ulong)local_1e0._M_dataplus._M_p);
  local_128 = &local_118;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_118 = *plVar7;
    uStack_110 = (undefined4)plVar5[3];
    uStack_10c = *(undefined4 *)((long)plVar5 + 0x1c);
  }
  else {
    local_118 = *plVar7;
    local_128 = (long *)*plVar5;
  }
  local_120 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar2 = (osPrefix->_M_dataplus)._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + osPrefix->_M_string_length);
  StringUtils::toLower(&local_70,&local_d0);
  plVar5 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)local_1e0._M_dataplus._M_p);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1c0.field_2._M_allocated_capacity = *psVar8;
    local_1c0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar8;
    local_1c0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1c0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1c0);
  local_108 = &local_f8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_f8 = *plVar7;
    lStack_f0 = plVar5[3];
  }
  else {
    local_f8 = *plVar7;
    local_108 = (long *)*plVar5;
  }
  local_100 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __l._M_len = 4;
  __l._M_array = (iterator)local_168;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e8,__l,&local_1e1);
  lVar9 = 0;
  do {
    if ((void *)((long)&local_f8 + lVar9) != *(void **)((long)&local_108 + lVar9)) {
      operator_delete(*(void **)((long)&local_108 + lVar9));
    }
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_1a0 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_170 = local_e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(local_198->map)._M_t._M_impl.super__Rb_tree_header;
    pbVar10 = local_e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      for (p_Var6 = (local_198->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != p_Var1;
          p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6)) {
        ::std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>
                *)local_168,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>
                *)(p_Var6 + 1));
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c0,local_168._0_8_,(pointer)(local_168._0_8_ + local_168._8_8_)
                  );
        StringUtils::toLower(&local_190,&local_1c0);
        _Var3._M_p = local_190._M_dataplus._M_p;
        if (local_190._M_string_length == pbVar10->_M_string_length) {
          if (local_190._M_string_length == 0) {
            bVar12 = true;
          }
          else {
            iVar4 = bcmp(local_190._M_dataplus._M_p,(pbVar10->_M_dataplus)._M_p,
                         local_190._M_string_length);
            bVar12 = iVar4 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var3._M_p != &local_190.field_2) {
          operator_delete(_Var3._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p);
        }
        if (local_138[0] != (_Manager_type)0x0) {
          (*local_138[0])((_Any_data *)(local_168 + 0x20),(_Any_data *)(local_168 + 0x20),
                          __destroy_functor);
        }
        if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
          operator_delete((void *)local_168._0_8_);
        }
        if (bVar12) break;
      }
      psVar11 = local_1a0;
      if ((_Rb_tree_header *)p_Var6 != p_Var1) {
        (local_1a0->_M_dataplus)._M_p = (pointer)&local_1a0->field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a0,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        goto LAB_00157f29;
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != local_170);
  }
  (local_1a0->_M_dataplus)._M_p = (pointer)&local_1a0->field_2;
  local_1a0->_M_string_length = 0;
  (local_1a0->field_2)._M_local_buf[0] = '\0';
  psVar11 = local_1a0;
LAB_00157f29:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  return psVar11;
}

Assistant:

std::string ReporterFactory::findReporterName(const std::string& osPrefix,
                                                  const std::string& reporterName) const
    {
        auto trimmedReporterName = StringUtils::trim(reporterName);
        trimmedReporterName = StringUtils::toLower(trimmedReporterName);

        std::vector<std::string> candidateNames = {
            trimmedReporterName,
            // Allow program names to be specified without Reporter suffix
            trimmedReporterName + "reporter",
            // Allow names without os namespace
            StringUtils::toLower(osPrefix) + trimmedReporterName,
            StringUtils::toLower(osPrefix) + trimmedReporterName + "reporter",
        };

        for (auto& candidateName : candidateNames)
        {
            auto iter = std::find_if(
                map.begin(), map.end(), [&](const Reporters::value_type pair) {
                    return StringUtils::toLower(pair.first) == candidateName;
                });

            if (iter != map.end())
            {
                return iter->first;
            }
        }

        return std::string{};
    }